

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  pointer pbVar2;
  undefined8 uVar3;
  size_type sVar4;
  char cVar5;
  int iVar6;
  OptionAdder *pOVar7;
  ostream *poVar8;
  const_iterator cVar9;
  OptionDetails *pOVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  int *piVar13;
  undefined8 *in_RSI;
  pointer pbVar14;
  int in_EDI;
  undefined4 uVar15;
  Information *device;
  Options *pOVar16;
  _Alloc_hider _Var17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  uint role;
  FunKeyMonkeyModule module;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> inputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moduleArgs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> deviceRoles;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> devices_1;
  Options options;
  OptionException e;
  string local_c38;
  undefined1 local_c18 [16];
  undefined1 local_c08 [64];
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  Options *local_b48;
  pointer local_b40;
  undefined1 local_b38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  undefined1 local_b18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b08;
  undefined1 local_af8 [16];
  undefined1 local_ae8 [32];
  string local_ac8;
  undefined1 local_aa8 [32];
  undefined1 local_a88 [32];
  shared_ptr<const_cxxopts::Value> local_a68;
  shared_ptr<const_cxxopts::Value> local_a58;
  shared_ptr<const_cxxopts::Value> local_a48;
  shared_ptr<const_cxxopts::Value> local_a38;
  shared_ptr<const_cxxopts::Value> local_a28;
  shared_ptr<const_cxxopts::Value> local_a18;
  undefined1 local_a08 [20];
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  shared_ptr<const_cxxopts::Value> local_9e8;
  shared_ptr<const_cxxopts::Value> local_9d8;
  pointer local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9b8;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8f0;
  size_type local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8d0;
  size_type local_8c8;
  uint local_8c0 [2];
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  char **local_8b0;
  Options local_8a8;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  undefined4 local_668;
  undefined4 uStack_664;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_638;
  undefined1 local_628 [64];
  ios_base local_5e8 [8];
  ios_base local_5e0 [1456];
  
  local_c08._60_4_ = in_EDI;
  std::__cxx11::string::string((string *)&local_8d0,(char *)*in_RSI,(allocator *)local_658);
  local_8f0 = &local_8e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f0," - A evdev/uinput wrangler","");
  local_8a8.m_program._M_dataplus._M_p = (pointer)&local_8a8.m_program.field_2;
  if (local_8d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0) {
    local_8a8.m_program.field_2._8_4_ = uStack_8b8;
    local_8a8.m_program.field_2._12_4_ = uStack_8b4;
  }
  else {
    local_8a8.m_program._M_dataplus._M_p = (pointer)local_8d0;
  }
  local_8a8.m_help_string._M_dataplus._M_p = (pointer)&local_8a8.m_help_string.field_2;
  local_8a8.m_program._M_string_length = local_8c8;
  local_8c8 = 0;
  local_8c0[0] = local_8c0[0] & 0xffffff00;
  if (local_8f0 == &local_8e0) {
    local_8a8.m_help_string.field_2._8_4_ = local_8e0._8_4_;
    local_8a8.m_help_string.field_2._12_4_ = local_8e0._12_4_;
  }
  else {
    local_8a8.m_help_string._M_dataplus._M_p = (pointer)local_8f0;
  }
  local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8a8.m_help_string._M_string_length = local_8e8;
  local_8e8 = 0;
  local_8e0._M_allocated_capacity._0_4_ = local_8e0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8a8.m_positional._M_dataplus._M_p = (pointer)&local_8a8.m_positional.field_2;
  local_8a8.m_positional._M_string_length = 0;
  local_8a8.m_positional.field_2._M_local_buf[0] = '\0';
  local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b48 = (Options *)local_b38;
  local_8f0 = &local_8e0;
  local_8d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8c0;
  local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8a8.m_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8a8.m_help._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"");
  local_648._0_8_ = local_b40;
  if (local_b48 == (Options *)local_b38) {
    local_c08._12_4_ = local_b38._12_4_;
    local_c08._8_4_ = local_b38._8_4_;
    local_b48 = (Options *)local_c08;
  }
  local_c08._4_4_ = local_b38._4_4_;
  local_c08._0_4_ = local_b38._0_4_;
  local_b40 = (pointer)0x0;
  local_b38._0_4_ = local_b38._0_4_ & 0xffffff00;
  local_658._0_8_ = &local_8a8;
  local_658._8_8_ = local_b48;
  if (local_b48 == (Options *)local_c08) {
    aStack_638._M_allocated_capacity = local_c08._8_8_;
    local_658._8_8_ = (Options *)(local_648 + 8);
  }
  local_c18._0_8_ = local_c08;
  local_b48 = (Options *)local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"i,device","");
  local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c38,
             "Input device to read from, eg. /dev/input/event0, multiple can be provided","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_ba8,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_b88);
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_ba8._M_dataplus._M_p._0_4_;
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_ba8._M_dataplus._M_p._4_4_;
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_ba8._M_string_length;
  local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_ba8._M_string_length._4_4_;
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"PATH","");
  pOVar7 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_658,(string *)local_c18,&local_c38,&local_9d8,&local_708)
  ;
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"m,match-devices","");
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,
             "Regular expression to match device strings (format: \'<vendor>,<product>,<version>,<name>\') with, matching will be read, multiple can be provided"
             ,"");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_bc8,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_b68);
  local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_bc8._M_dataplus._M_p._0_4_;
  local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_bc8._M_dataplus._M_p._4_4_;
  local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_bc8._M_string_length;
  local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_bc8._M_string_length._4_4_;
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"PATTERN","");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_ba8,&local_b88,&local_9e8,&local_728);
  local_bc8._M_dataplus._M_p = (pointer)&local_bc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc8,"r,roles","");
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b68,
             "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role."
             ,"");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)(local_aa8 + 0x20),
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_910);
  local_a08._16_4_ = local_a88._0_4_;
  uStack_9f4 = local_a88._4_4_;
  uStack_9f0 = local_a88._8_4_;
  uStack_9ec = local_a88._12_4_;
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"ROLES","");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,&local_bc8,&local_b68,
                      (shared_ptr<const_cxxopts::Value> *)(local_a08 + 0x10),&local_748);
  local_a88._0_8_ = local_a88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_aa8 + 0x20),"p,plugin","");
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"Path to plugin","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_aa8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_930);
  local_a08._0_4_ = local_aa8._0_4_;
  local_a08._4_4_ = local_aa8._4_4_;
  local_a08._8_4_ = local_aa8._8_4_;
  local_a08._12_4_ = local_aa8._12_4_;
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"PATH","");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)(local_aa8 + 0x20),&local_910,
                      (shared_ptr<const_cxxopts::Value> *)local_a08,&local_768);
  local_aa8._0_8_ = local_aa8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"g,grab","");
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_930,"Grab the input device, preventing others from accessing it","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_ac8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_950);
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_ac8._M_dataplus._M_p._0_4_;
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_ac8._M_dataplus._M_p._4_4_;
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_ac8._M_string_length;
  local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_ac8._M_string_length._4_4_;
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)local_aa8,&local_930,&local_a18,&local_788);
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"v,verbose","");
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_950,"Print extra runtime information","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             (local_b38 + 0x50),(allocator<cxxopts::values::standard_value<bool>_> *)&local_970);
  local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_ae8._0_4_;
  local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_ae8._4_4_;
  local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_ae8._8_4_;
  local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_ae8._12_4_;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_ac8,&local_950,&local_a28,&local_7a8);
  local_ae8._0_8_ = local_b38 + 0x60;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b38 + 0x50),"d,daemonize","");
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"Daemonize process","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             (local_b38 + 0x30),(allocator<cxxopts::values::standard_value<bool>_> *)&local_990);
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_b08._M_allocated_capacity._0_4_;
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_b08._M_allocated_capacity._4_4_;
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_b08._8_4_;
  local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_b08._12_4_;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)(local_b38 + 0x50),&local_970,&local_a38,&local_688);
  local_b08._M_allocated_capacity = (size_type)(local_b38 + 0x40);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b38 + 0x30),"l,list-devices","");
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"List available devices","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             (local_b38 + 0x10),(allocator<cxxopts::values::standard_value<bool>_> *)&local_9b0);
  local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_b28._M_allocated_capacity._0_4_;
  local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_b28._M_allocated_capacity._4_4_;
  local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_b28._8_4_;
  local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_b28._12_4_;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)(local_b38 + 0x30),&local_990,&local_a48,&local_6a8);
  local_b28._M_allocated_capacity = (size_type)(local_b38 + 0x20);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b38 + 0x10),"X,plugin-parameter","");
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"Plugin parameter","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_7e8,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_6e8);
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_7e8._M_dataplus._M_p._0_4_;
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_7e8._M_dataplus._M_p._4_4_;
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_7e8._M_string_length;
  local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_7e8._M_string_length._4_4_;
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"ARG","");
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)(local_b38 + 0x10),&local_9b0,&local_a58,&local_7c8);
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"h,help","");
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"Print help","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_668,(allocator<cxxopts::values::standard_value<bool>_> *)(local_c08 + 0x2f));
  local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_668;
  local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_664;
  local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_660;
  local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_65c;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  cxxopts::OptionAdder::operator()(pOVar7,&local_7e8,&local_6e8,&local_a68,&local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a68.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a68.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a58.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a58.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b28._M_allocated_capacity != local_b38 + 0x20) {
    operator_delete((void *)local_b28._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a48.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a48.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b08._M_allocated_capacity != local_b38 + 0x40) {
    operator_delete((void *)local_b08._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a38.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a38.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_ae8._0_8_ != (_Base_ptr)(local_b38 + 0x60)) {
    operator_delete((void *)local_ae8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a28.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a28.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a18.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a18.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p);
  }
  if ((undefined1 *)local_aa8._0_8_ != local_aa8 + 0x10) {
    operator_delete((void *)local_aa8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_a08._12_4_,local_a08._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a08._12_4_,local_a08._8_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_a88._0_8_ != (_Base_ptr)(local_a88 + 0x10)) {
    operator_delete((void *)local_a88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_9ec,uStack_9f0) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_9ec,uStack_9f0));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc8._M_dataplus._M_p != &local_bc8.field_2) {
    operator_delete(local_bc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_9e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_9e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_9e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_9d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_9d8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_9d8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p);
  }
  if ((undefined1 *)local_c18._0_8_ != local_c08) {
    operator_delete((void *)local_c18._0_8_);
  }
  if ((Options *)local_658._8_8_ != (Options *)(local_648 + 8)) {
    operator_delete((void *)local_658._8_8_);
  }
  if (local_b48 != (Options *)local_b38) {
    operator_delete(local_b48);
  }
  if (local_c08._60_4_ == 1) {
    local_658._0_8_ = local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"");
    aStack_638._M_allocated_capacity = (size_type)local_628;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_638,"Group","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_658;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c38,__l,(allocator_type *)&local_ba8);
    cxxopts::Options::help
              ((string *)local_c18,&local_8a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c38);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_c18._0_8_,local_c18._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((undefined1 *)local_c18._0_8_ != local_c08) {
      operator_delete((void *)local_c18._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c38);
    lVar18 = 0;
    do {
      if (local_628 + lVar18 != *(undefined1 **)((long)&aStack_638 + lVar18)) {
        operator_delete(*(undefined1 **)((long)&aStack_638 + lVar18));
      }
      lVar18 = lVar18 + -0x20;
    } while (lVar18 != -0x40);
  }
  else {
    cxxopts::Options::parse(&local_8a8,(int *)(local_c08 + 0x3c),&local_8b0);
    local_658._0_8_ = (Options *)local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"v","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
            ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
    if ((_Rb_tree_header *)cVar9._M_node == &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header)
    {
      local_c08._52_4_ = 0;
    }
    else {
      local_c08._52_4_ =
           (undefined4)
           CONCAT71((int7)((ulong)*(long *)(cVar9._M_node + 2) >> 8),
                    0 < *(int *)(*(long *)(cVar9._M_node + 2) + 0x30));
    }
    if ((Options *)local_658._0_8_ != (Options *)local_648) {
      operator_delete((void *)local_658._0_8_);
    }
    local_658._0_8_ = (Options *)local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"h","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
            ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
    if ((_Rb_tree_header *)cVar9._M_node == &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header)
    {
      bVar20 = true;
    }
    else {
      bVar20 = *(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 0;
    }
    if ((Options *)local_658._0_8_ != (Options *)local_648) {
      operator_delete((void *)local_658._0_8_);
    }
    if (bVar20) {
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"l","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
              ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
      if ((_Rb_tree_header *)cVar9._M_node ==
          &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) {
        bVar20 = true;
      }
      else {
        bVar20 = *(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 0;
      }
      if ((Options *)local_658._0_8_ != (Options *)local_648) {
        operator_delete((void *)local_658._0_8_);
      }
      if (bVar20) {
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"i","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
        if (((_Rb_tree_header *)cVar9._M_node ==
             &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) ||
           (*(int *)(*(long *)(cVar9._M_node + 2) + 0x30) < 1)) {
          local_c18._0_8_ = local_c08;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"m","");
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                  ::find(&local_8a8.m_options._M_t,(key_type *)local_c18);
          if ((_Rb_tree_header *)cVar9._M_node ==
              &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) {
            bVar20 = true;
          }
          else {
            bVar20 = *(int *)(*(long *)(cVar9._M_node + 2) + 0x30) < 1;
          }
          if ((undefined1 *)local_c18._0_8_ != local_c08) {
            operator_delete((void *)local_c18._0_8_);
          }
        }
        else {
          bVar20 = false;
        }
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        if (bVar20) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR: at least one input device path or match pattern is required",0x42);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
          std::ostream::put(-0x48);
          iVar6 = 1;
          std::ostream::flush();
          goto LAB_001211d0;
        }
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"p","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
        if ((_Rb_tree_header *)cVar9._M_node ==
            &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) {
          bVar20 = false;
        }
        else {
          bVar20 = *(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 1;
        }
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        if (!bVar20) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: exactly one plugin is required",0x25);
          iVar6 = 1;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          goto LAB_001211d0;
        }
        local_b88._M_dataplus._M_p = (pointer)0x0;
        local_b88._M_string_length = 0;
        local_b88.field_2._M_allocated_capacity = 0;
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"r","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
        if ((_Rb_tree_header *)cVar9._M_node ==
            &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) {
          bVar20 = true;
        }
        else {
          bVar20 = *(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 0;
        }
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        if (bVar20) {
LAB_0012165c:
          local_bc8._M_dataplus._M_p = (pointer)0x0;
          local_bc8._M_string_length = 0;
          local_bc8.field_2._M_allocated_capacity = 0;
          local_658._0_8_ = (Options *)local_648;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"i","");
          pOVar10 = cxxopts::Options::operator[](&local_8a8,(string *)local_658);
          pvVar12 = cxxopts::OptionDetails::
                    as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              (pOVar10);
          if ((Options *)local_658._0_8_ != (Options *)local_648) {
            operator_delete((void *)local_658._0_8_);
          }
          pbVar14 = (pvVar12->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar14 != pbVar2) {
            do {
              lVar18 = (long)(local_bc8._M_string_length - (long)local_bc8._M_dataplus._M_p) >> 3;
              uVar15 = 0;
              if ((ulong)(lVar18 * -0x3333333333333333) <
                  (ulong)((long)(local_b88._M_string_length - (long)local_b88._M_dataplus._M_p) >> 2
                         )) {
                uVar15 = *(undefined4 *)(local_b88._M_dataplus._M_p + lVar18 * 0x3333333333333334);
              }
              pcVar1 = (pbVar14->_M_dataplus)._M_p;
              local_658._0_8_ = (Options *)local_648;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_658,pcVar1,pcVar1 + pbVar14->_M_string_length);
              aStack_638._M_allocated_capacity._0_4_ = uVar15;
              std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
              emplace_back<EvdevDevice::Input>
                        ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                         &local_bc8,(Input *)local_658);
              if ((Options *)local_658._0_8_ != (Options *)local_648) {
                operator_delete((void *)local_658._0_8_);
              }
              pbVar14 = pbVar14 + 1;
            } while (pbVar14 != pbVar2);
          }
          local_658._0_8_ = (Options *)local_648;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"m","");
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                  ::find(&local_8a8.m_options._M_t,(key_type *)local_658);
          if ((_Rb_tree_header *)cVar9._M_node ==
              &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) {
            bVar20 = false;
          }
          else {
            bVar20 = 0 < *(int *)(*(long *)(cVar9._M_node + 2) + 0x30);
          }
          if ((Options *)local_658._0_8_ != (Options *)local_648) {
            operator_delete((void *)local_658._0_8_);
          }
          if (bVar20) {
            uVar19 = local_bc8._M_string_length - (long)local_bc8._M_dataplus._M_p;
            EvdevDevice::availableDevices();
            local_658._0_8_ = (Options *)local_648;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"m","");
            pOVar10 = cxxopts::Options::operator[](&local_8a8,(string *)local_658);
            pvVar12 = cxxopts::OptionDetails::
                      as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                (pOVar10);
            if ((Options *)local_658._0_8_ != (Options *)local_648) {
              operator_delete((void *)local_658._0_8_);
            }
            pbVar14 = (pvVar12->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_9c0 = (pvVar12->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            if (pbVar14 != local_9c0) {
              local_c08._48_4_ = (int)(uVar19 >> 3) * -0x33333333;
              do {
                local_9b8 = pbVar14;
                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                basic_regex<std::char_traits<char>,std::allocator<char>>
                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_c38,pbVar14,
                           0x10);
                sVar4 = local_b68._M_string_length;
                local_c08._56_4_ = 0;
                _Var17._M_p = local_b68._M_dataplus._M_p;
                if ((ulong)(uint)local_c08._48_4_ <
                    (ulong)((long)(local_b88._M_string_length - (long)local_b88._M_dataplus._M_p) >>
                           2)) {
                  local_c08._56_4_ =
                       *(undefined4 *)
                        (local_b88._M_dataplus._M_p + (ulong)(uint)local_c08._48_4_ * 4);
                }
                for (; _Var17._M_p != (pointer)sVar4;
                    _Var17._M_p = (pointer)((long)_Var17._M_p + 0x50)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                  *(uint *)((long)&role +
                           (long)&(*(_Base_ptr *)(local_658._0_8_ + -0x18))[-0x32]._M_color) =
                       *(uint *)((long)&role +
                                (long)&(*(_Base_ptr *)(local_658._0_8_ + -0x18))[-0x32]._M_color) &
                       0xffffffb5 | 8;
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,*(char **)(_Var17._M_p + 0x10),*(long *)(_Var17._M_p + 0x18));
                  std::__cxx11::stringbuf::str();
                  local_c08._0_4_ = 0;
                  local_c08._4_4_ = 0;
                  local_c08._8_8_ = (undefined1 *)0x0;
                  local_c18._0_8_ = (char *)0x0;
                  local_c18._8_8_ = (pointer)0x0;
                  bVar20 = std::__detail::
                           __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                     ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_ba8._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_ba8._M_dataplus._M_p +
                                        CONCAT44(local_ba8._M_string_length._4_4_,
                                                 (undefined4)local_ba8._M_string_length)),
                                      (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)local_c18,
                                      (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                      &local_c38,0);
                  if ((char *)local_c18._0_8_ != (char *)0x0) {
                    operator_delete((void *)local_c18._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
                    operator_delete(local_ba8._M_dataplus._M_p);
                  }
                  if (bVar20) {
                    local_c18._0_8_ = local_c08;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_c18,*(long *)(_Var17._M_p + 0x30),
                               *(long *)(_Var17._M_p + 0x38) + *(long *)(_Var17._M_p + 0x30));
                    local_c08._16_4_ = local_c08._56_4_;
                    std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
                    emplace_back<EvdevDevice::Input>
                              ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                               &local_bc8,(Input *)local_c18);
                    if ((undefined1 *)local_c18._0_8_ != local_c08) {
                      operator_delete((void *)local_c18._0_8_);
                    }
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                  std::ios_base::~ios_base(local_5e8);
                }
                local_c08._48_4_ = local_c08._48_4_ + 1;
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_c38);
                pbVar14 = local_9b8 + 1;
              } while (pbVar14 != local_9c0);
            }
            std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::
            ~vector((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
                    &local_b68);
          }
          sVar4 = local_bc8._M_string_length;
          _Var17._M_p = local_bc8._M_dataplus._M_p;
          if (local_c08[0x34] != '\0') {
            for (; _Var17._M_p != (pointer)sVar4; _Var17._M_p = (pointer)((long)_Var17._M_p + 0x28))
            {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Using device ",0xd);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,*(char **)_Var17._M_p,
                                  *(undefined8 *)((long)_Var17._M_p + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," with role ",0xb);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
          }
          EvdevDevice::EvdevDevice
                    ((EvdevDevice *)local_658,
                     (vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&local_bc8);
          p_evdev = (EvdevDevice *)local_658;
          if (local_658._0_8_ == local_658._8_8_) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: Could not open input device",0x22);
            iVar6 = 1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"p","");
            pOVar10 = cxxopts::Options::operator[](&local_8a8,&local_c38);
            pbVar11 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar10);
            FunKeyMonkeyModule::FunKeyMonkeyModule((FunKeyMonkeyModule *)local_c18,pbVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
              operator_delete(local_c38._M_dataplus._M_p);
            }
            uVar3 = local_c18._0_8_;
            if ((char *)local_c18._0_8_ == (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ERROR: Could not open plugin",0x1c);
              iVar6 = 1;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            else {
              local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"g","");
              cVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                      ::find(&local_8a8.m_options._M_t,&local_c38);
              if (((_Rb_tree_header *)cVar9._M_node ==
                   &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) ||
                 (*(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 0)) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
                  operator_delete(local_c38._M_dataplus._M_p);
                }
LAB_00121ca7:
                local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"d","");
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                        ::find(&local_8a8.m_options._M_t,&local_c38);
                if (((_Rb_tree_header *)cVar9._M_node ==
                     &local_8a8.m_options._M_t._M_impl.super__Rb_tree_header) ||
                   (*(int *)(*(long *)(cVar9._M_node + 2) + 0x30) == 0)) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
                    operator_delete(local_c38._M_dataplus._M_p);
                  }
                }
                else {
                  iVar6 = daemon(1,0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
                    operator_delete(local_c38._M_dataplus._M_p);
                  }
                  if (iVar6 == -1) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ERROR: Could not daemonize, error code ",0x27)
                    ;
                    piVar13 = __errno_location();
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*piVar13);
                    goto LAB_00121d47;
                  }
                }
                local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"X","");
                pOVar10 = cxxopts::Options::operator[](&local_8a8,&local_c38);
                pvVar12 = cxxopts::OptionDetails::
                          as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    (pOVar10);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_ba8,pvVar12);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
                  operator_delete(local_c38._M_dataplus._M_p);
                }
                process((EvdevDevice *)local_658,(FunKeyMonkeyModule *)local_c18,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_ba8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_ba8);
                iVar6 = 0;
              }
              else {
                bVar20 = EvdevDevice::grab((EvdevDevice *)local_658,true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
                  operator_delete(local_c38._M_dataplus._M_p);
                }
                if (bVar20) goto LAB_00121ca7;
                poVar8 = (ostream *)&std::cerr;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"ERROR: Could not grab input device",0x22);
LAB_00121d47:
                iVar6 = 1;
                std::endl<char,std::char_traits<char>>(poVar8);
              }
              dlclose(uVar3);
            }
          }
          EvdevDevice::~EvdevDevice((EvdevDevice *)local_658);
          std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::~vector
                    ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&local_bc8);
        }
        else {
          local_658._0_8_ = (Options *)local_648;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"r","");
          pOVar10 = cxxopts::Options::operator[](&local_8a8,(string *)local_658);
          pbVar11 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar10);
          local_c18._0_8_ = local_c08;
          pcVar1 = (pbVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c18,pcVar1,pcVar1 + pbVar11->_M_string_length);
          if ((Options *)local_658._0_8_ != (Options *)local_648) {
            operator_delete((void *)local_658._0_8_);
          }
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_658,(string *)local_c18,_S_in);
          bVar20 = false;
          iVar6 = 0;
          if ((aStack_638._M_local_buf[(long)*(_Base_ptr *)(local_658._0_8_ + -0x18)] & 5U) == 0) {
            do {
              local_c38._M_dataplus._M_p = local_c38._M_dataplus._M_p & 0xffffffff00000000;
              std::istream::_M_extract<unsigned_int>((uint *)local_658);
              if ((aStack_638._M_local_buf[(long)*(_Base_ptr *)(local_658._0_8_ + -0x18)] & 5U) != 0
                 ) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"ERROR: Invalid role list: ",0x1a);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_c18._0_8_,local_c18._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
LAB_00121616:
                iVar6 = 1;
                bVar20 = true;
                goto LAB_0012161e;
              }
              if (local_b88._M_string_length == local_b88.field_2._M_allocated_capacity) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b88,
                           (iterator)local_b88._M_string_length,(uint *)&local_c38);
              }
              else {
                *(uint *)local_b88._M_string_length = (uint)local_c38._M_dataplus._M_p;
                local_b88._M_string_length = local_b88._M_string_length + 4;
              }
              cVar5 = std::istream::get();
              if ((cVar5 != ',') &&
                 ((*(uint *)((long)&aStack_638 + (long)*(_Base_ptr *)(local_658._0_8_ + -0x18)) & 5)
                  == 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"ERROR: Invalid role list: ",0x1a);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_c18._0_8_,local_c18._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                goto LAB_00121616;
              }
            } while ((*(uint *)((long)&aStack_638 + (long)*(_Base_ptr *)(local_658._0_8_ + -0x18)) &
                     5) == 0);
            bVar20 = false;
            iVar6 = 0;
          }
LAB_0012161e:
          std::__cxx11::istringstream::~istringstream((istringstream *)local_658);
          std::ios_base::~ios_base(local_5e0);
          if ((undefined1 *)local_c18._0_8_ != local_c08) {
            operator_delete((void *)local_c18._0_8_);
          }
          if (!bVar20) goto LAB_0012165c;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b88._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b88._M_dataplus._M_p);
        }
        goto LAB_001211d0;
      }
      EvdevDevice::availableDevices();
      uVar3 = local_658._8_8_;
      for (pOVar16 = (Options *)local_658._0_8_; pOVar16 != (Options *)uVar3;
          pOVar16 = (Options *)
                    &(pOVar16->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
             0xffffffb5 | 8;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)(pOVar16->m_help_string).field_2._M_allocated_capacity,
                            *(long *)((long)&(pOVar16->m_help_string).field_2 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)(pOVar16->m_program).field_2._M_allocated_capacity,
                            *(long *)((long)&(pOVar16->m_program).field_2 + 8));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
                ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
                 local_658);
    }
    else {
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"");
      aStack_638._M_allocated_capacity = (size_type)local_628;
      std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_638,"Group","");
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_658;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c38,__l_00,(allocator_type *)&local_ba8);
      cxxopts::Options::help
                ((string *)local_c18,&local_8a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_c38);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_c18._0_8_,local_c18._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((undefined1 *)local_c18._0_8_ != local_c08) {
        operator_delete((void *)local_c18._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c38);
      lVar18 = 0;
      do {
        if (local_628 + lVar18 != *(undefined1 **)((long)&aStack_638 + lVar18)) {
          operator_delete(*(undefined1 **)((long)&aStack_638 + lVar18));
        }
        lVar18 = lVar18 + -0x20;
      } while (lVar18 != -0x40);
    }
  }
  iVar6 = 0;
LAB_001211d0:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
  ::~_Rb_tree(&local_8a8.m_help._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_positional._M_dataplus._M_p != &local_8a8.m_positional.field_2) {
    operator_delete(local_8a8.m_positional._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
  ::~_Rb_tree(&local_8a8.m_options._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_help_string._M_dataplus._M_p != &local_8a8.m_help_string.field_2) {
    operator_delete(local_8a8.m_help_string._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_program._M_dataplus._M_p != &local_8a8.m_program.field_2) {
    operator_delete(local_8a8.m_program._M_dataplus._M_p);
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
  cxxopts::Options options(argv[0], " - A evdev/uinput wrangler");
  options.add_options()
    ("i,device", "Input device to read from, eg. /dev/input/event0, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATH")
    ("m,match-devices", "Regular expression to match device strings (format: '<vendor>,<product>,<version>,<name>') with, matching will be read, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATTERN")
    ("r,roles", "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role.", cxxopts::value<std::string>(), "ROLES")
    ("p,plugin", "Path to plugin", cxxopts::value<std::string>(), "PATH")
    ("g,grab", "Grab the input device, preventing others from accessing it")
    ("v,verbose", "Print extra runtime information")
    ("d,daemonize", "Daemonize process")
    ("l,list-devices", "List available devices")
    ("X,plugin-parameter", "Plugin parameter",
     cxxopts::value<std::vector<std::string>>(), "ARG")
    ("h,help", "Print help");

  if(argc == 1)
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  try
  {
    options.parse(argc, argv);
  }
  catch(cxxopts::OptionException e)
  {
    std::cerr << "ERROR: parsing options failed: " << e.what() << std::endl;
    return EXIT_FAILURE;
  }

  bool const verbose = options.count("v") > 0;

  if(options.count("h"))
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  if(options.count("l"))
  {
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(EvdevDevice::Information const& device : devices)
    {
      std::cout << std::hex
        << device.path << ": "
        << device.vendor << ","
        << device.product << ","
        << device.version << ","
        << device.name << std::endl;
    }
    return EXIT_SUCCESS;
  }

  if(options.count("i") < 1 && options.count("m") < 1)
  {
    std::cerr << "ERROR: at least one input device path or match pattern is required" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("p") != 1)
  {
    std::cerr << "ERROR: exactly one plugin is required" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<unsigned int> deviceRoles;
  if(options.count("r"))
  {
    std::string const roles = options["r"].as<std::string>();
    std::istringstream iss(roles);
    while(iss)
    {
      unsigned int role = 0;
      iss >> role;

      if(!iss)
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }

      deviceRoles.push_back(role);

      char separator = iss.get();
      if(iss && separator != ',')
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }
    }
  }

  std::vector<EvdevDevice::Input> inputs;
  for(std::string const& path : options["i"].as<std::vector<std::string>>())
  {
    unsigned int role = deviceRoles.size() > inputs.size() ? deviceRoles.at(inputs.size()) : 0;
    inputs.push_back({path, role});
  }

  if(options.count("m") > 0)
  {
    unsigned int roleIndex = inputs.size();
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(std::string const& pattern : options["m"].as<std::vector<std::string>>())
    {
      std::regex re(pattern);
      unsigned int role = deviceRoles.size() > roleIndex ? deviceRoles.at(roleIndex) : 0;
      for(EvdevDevice::Information const& info : devices)
      {
        std::ostringstream deviceString;
        deviceString << std::hex
          << info.vendor << ","
          << info.product << ","
          << info.version << ","
          << info.name;
        if(std::regex_search(deviceString.str(), re))
        {
          inputs.push_back({info.path, role});
        }
      }
      roleIndex += 1;
    }
  }

  if(verbose)
  {
    for(auto const& input : inputs)
    {
      std::cout << "Using device " << input.path << " with role " << input.role << std::endl;
    }
  }

  EvdevDevice evdev(inputs);
  p_evdev  = &evdev;

  if(!evdev.ready())
  {
    std::cerr << "ERROR: Could not open input device" << std::endl;
    return EXIT_FAILURE;
  }

  FunKeyMonkeyModule module(options["p"].as<std::string>());

  if(!module.ready())
  {
    std::cerr << "ERROR: Could not open plugin" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("g") && !evdev.grab(true))
  {
    std::cerr << "ERROR: Could not grab input device" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("d") && daemon(1, 0) == -1)
  {
    std::cerr << "ERROR: Could not daemonize, error code " << errno << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<std::string> moduleArgs = options["X"].as<std::vector<std::string>>();

  process(evdev, module, moduleArgs);

  return EXIT_SUCCESS;
}